

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void ttwindow(int top,int bot)

{
  undefined8 uVar1;
  int bot_local;
  int top_local;
  
  if ((*(long *)(*(long *)(_cur_term + 0x20) + 0x18) != 0) && ((tttop != top || (ttbot != bot)))) {
    uVar1 = tgoto(*(undefined8 *)(*(long *)(_cur_term + 0x20) + 0x18),bot,top);
    tputs(uVar1,nrow - ttrow,ttputc);
    ttrow = 1000;
    ttcol = 1000;
    tttop = top;
    ttbot = bot;
  }
  return;
}

Assistant:

void
ttwindow(int top, int bot)
{
	if (change_scroll_region && (tttop != top || ttbot != bot)) {
		putpad(tgoto(change_scroll_region, bot, top), nrow - ttrow);
		ttrow = HUGE;	/* Unknown.		 */
		ttcol = HUGE;
		tttop = top;	/* Remember region.	 */
		ttbot = bot;
	}
}